

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

int __thiscall
QCommandLinkButtonPrivate::descriptionHeight(QCommandLinkButtonPrivate *this,int widgetWidth)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextEngine *extraout_RDX;
  int in_ESI;
  QCommandLinkButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar4;
  qreal descriptionheight;
  int lineWidth;
  QTextLine line;
  QTextLayout layout;
  undefined4 in_stack_ffffffffffffffa0;
  qreal local_58;
  undefined4 in_stack_ffffffffffffffb0;
  QPointF local_40;
  undefined1 *local_30;
  QTextEngine *local_28;
  QTextLayout local_20;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = textOffset((QCommandLinkButtonPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
  iVar2 = in_ESI - iVar2;
  iVar3 = rightMargin(in_RDI);
  iVar3 = iVar2 - iVar3;
  local_58 = 0.0;
  bVar1 = QString::isEmpty((QString *)0x555c62);
  if (!bVar1) {
    local_20.d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::QTextLayout(&local_20,(QString *)&in_RDI->description);
    descriptionFont((QCommandLinkButtonPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffffa0));
    QTextLayout::setFont((QFont *)&local_20);
    QFont::~QFont(local_18);
    QTextLayout::beginLayout();
    while( true ) {
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      iVar2 = QTextLayout::createLine();
      local_30 = (undefined1 *)CONCAT44(local_30._4_4_,iVar2);
      local_28 = extraout_RDX;
      bVar1 = QTextLine::isValid((QTextLine *)&local_30);
      if (!bVar1) break;
      QTextLine::setLineWidth((double)iVar3);
      QPointF::QPointF(&local_40,0.0,local_58);
      QTextLine::setPosition((QPointF *)&local_30);
      dVar4 = (double)QTextLine::height();
      local_58 = dVar4 + local_58;
    }
    QTextLayout::endLayout();
    QTextLayout::~QTextLayout(&local_20);
  }
  iVar2 = qCeil<double>(2.76403592775512e-317);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QCommandLinkButtonPrivate::descriptionHeight(int widgetWidth) const
{
    // Calc width of actual paragraph
    int lineWidth = widgetWidth - textOffset() - rightMargin();

    qreal descriptionheight = 0;
    if (!description.isEmpty()) {
        QTextLayout layout(description);
        layout.setFont(descriptionFont());
        layout.beginLayout();
        while (true) {
            QTextLine line = layout.createLine();
            if (!line.isValid())
                break;
            line.setLineWidth(lineWidth);
            line.setPosition(QPointF(0, descriptionheight));
            descriptionheight += line.height();
        }
        layout.endLayout();
    }
    return qCeil(descriptionheight);
}